

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSComputerRS232Port.h
# Opt level: O0

int CheckAvailBytesComputerRS232Port(HANDLE hDev,int *pNbBytesAvail)

{
  int iVar1;
  int local_24;
  int *piStack_20;
  int bytes_avail;
  int *pNbBytesAvail_local;
  HANDLE hDev_local;
  
  local_24 = 0;
  piStack_20 = pNbBytesAvail;
  pNbBytesAvail_local = (int *)hDev;
  iVar1 = ioctl((int)hDev,0x541b,&local_24);
  if (iVar1 == 0) {
    if (local_24 < 1) {
      hDev_local._4_4_ = 2;
    }
    else {
      if (piStack_20 != (int *)0x0) {
        *piStack_20 = local_24;
      }
      hDev_local._4_4_ = 0;
    }
  }
  else {
    hDev_local._4_4_ = 1;
  }
  return hDev_local._4_4_;
}

Assistant:

inline int CheckAvailBytesComputerRS232Port(HANDLE hDev, int* pNbBytesAvail)
{
#ifdef _WIN32
	COMSTAT stats;

	memset(&stats, 0, sizeof(COMSTAT));
	if (!ClearCommError(hDev, NULL, &stats))
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("CheckAvailableBytesComputerRS232Port error (%s) : %s(hDev=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev));
		return EXIT_FAILURE;
	}
	if (stats.cbInQue <= 0) return EXIT_TIMEOUT;
	if (pNbBytesAvail) *pNbBytesAvail = (int)stats.cbInQue;
#else
	int bytes_avail = 0;

	if (ioctl((intptr_t)hDev, FIONREAD, &bytes_avail) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("CheckAvailableBytesComputerRS232Port error (%s) : (FIONREAD) %s(hDev=%#x)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			hDev));
		return EXIT_FAILURE;
	}
	if (bytes_avail <= 0) return EXIT_TIMEOUT;
	if (pNbBytesAvail) *pNbBytesAvail = (int)bytes_avail;
#endif // _WIN32

	return EXIT_SUCCESS;
}